

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_relation.cpp
# Opt level: O3

string * __thiscall
duckdb::UpdateRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,UpdateRelation *this,idx_t depth)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  undefined8 *puVar4;
  long *plVar5;
  reference pvVar6;
  reference this_00;
  pointer pPVar7;
  ulong *puVar8;
  size_type *psVar9;
  long *plVar10;
  ulong uVar11;
  undefined8 uVar12;
  size_type __n;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  string *local_80;
  string local_78;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_80 = __return_storage_ptr__;
  Relation::RenderWhitespace_abi_cxx11_(&local_58,(Relation *)depth,depth);
  puVar4 = (undefined8 *)::std::__cxx11::string::append((char *)&local_58);
  puVar8 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar8) {
    local_b0 = *puVar8;
    lStack_a8 = puVar4[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *puVar8;
    local_c0 = (ulong *)*puVar4;
  }
  local_b8 = puVar4[1];
  *puVar4 = puVar8;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  ParseInfo::QualifierToString(&local_78,&this->catalog_name,&this->schema_name,&this->table_name);
  uVar11 = 0xf;
  if (local_c0 != &local_b0) {
    uVar11 = local_b0;
  }
  if (uVar11 < local_78._M_string_length + local_b8) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar12 = local_78.field_2._M_allocated_capacity;
    }
    if (local_78._M_string_length + local_b8 <= (ulong)uVar12) {
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_c0);
      goto LAB_00c4c97b;
    }
  }
  puVar4 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_78._M_dataplus._M_p);
LAB_00c4c97b:
  local_a0 = &local_90;
  plVar5 = puVar4 + 2;
  if ((long *)*puVar4 == plVar5) {
    local_90 = *plVar5;
    lStack_88 = puVar4[3];
  }
  else {
    local_90 = *plVar5;
    local_a0 = (long *)*puVar4;
  }
  local_98 = puVar4[1];
  *puVar4 = plVar5;
  puVar4[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_a0);
  local_38 = &local_80->field_2;
  (local_80->_M_dataplus)._M_p = (pointer)local_38;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    lVar3 = plVar5[3];
    local_38->_M_allocated_capacity = *psVar9;
    *(long *)((long)&local_80->field_2 + 8) = lVar3;
  }
  else {
    (local_80->_M_dataplus)._M_p = (pointer)*plVar5;
    (local_80->field_2)._M_allocated_capacity = *psVar9;
  }
  local_80->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  paVar1 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((this->expressions).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->expressions).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](&this->update_columns,__n);
      pcVar2 = (pvVar6->_M_dataplus)._M_p;
      local_58._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + pvVar6->_M_string_length);
      ::std::__cxx11::string::append((char *)&local_58);
      this_00 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::operator[](&this->expressions,__n);
      pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this_00);
      (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_78,pPVar7);
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        uVar12 = local_58.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_78._M_string_length + local_58._M_string_length) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          uVar12 = local_78.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_78._M_string_length + local_58._M_string_length)
        goto LAB_00c4cb2e;
        puVar4 = (undefined8 *)
                 ::std::__cxx11::string::replace
                           ((ulong)&local_78,0,(char *)0x0,(ulong)local_58._M_dataplus._M_p);
      }
      else {
LAB_00c4cb2e:
        puVar4 = (undefined8 *)
                 ::std::__cxx11::string::_M_append
                           ((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
      }
      local_c0 = &local_b0;
      puVar8 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar8) {
        local_b0 = *puVar8;
        lStack_a8 = puVar4[3];
      }
      else {
        local_b0 = *puVar8;
        local_c0 = (ulong *)*puVar4;
      }
      local_b8 = puVar4[1];
      *puVar4 = puVar8;
      puVar4[1] = 0;
      *(undefined1 *)puVar8 = 0;
      puVar4 = (undefined8 *)::std::__cxx11::string::append((char *)&local_c0);
      local_a0 = &local_90;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_90 = *plVar5;
        lStack_88 = puVar4[3];
      }
      else {
        local_90 = *plVar5;
        local_a0 = (long *)*puVar4;
      }
      local_98 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)local_80,(ulong)local_a0);
      if (local_a0 != &local_90) {
        operator_delete(local_a0);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(this->expressions).
                                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->expressions).
                                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if ((this->condition).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this->condition);
    (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_58);
    plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x12a9399);
    local_c0 = &local_b0;
    puVar8 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar8) {
      local_b0 = *puVar8;
      lStack_a8 = plVar5[3];
    }
    else {
      local_b0 = *puVar8;
      local_c0 = (ulong *)*plVar5;
    }
    local_b8 = plVar5[1];
    *plVar5 = (long)puVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_c0);
    local_a0 = &local_90;
    plVar10 = plVar5 + 2;
    if ((long *)*plVar5 == plVar10) {
      local_90 = *plVar10;
      lStack_88 = plVar5[3];
    }
    else {
      local_90 = *plVar10;
      local_a0 = (long *)*plVar5;
    }
    local_98 = plVar5[1];
    *plVar5 = (long)plVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)local_80,(ulong)local_a0);
    if (local_a0 != &local_90) {
      operator_delete(local_a0);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  return local_80;
}

Assistant:

string UpdateRelation::ToString(idx_t depth) {
	string str = RenderWhitespace(depth) + "UPDATE " +
	             ParseInfo::QualifierToString(catalog_name, schema_name, table_name) + " SET\n";
	for (idx_t i = 0; i < expressions.size(); i++) {
		str += update_columns[i] + " = " + expressions[i]->ToString() + "\n";
	}
	if (condition) {
		str += "WHERE " + condition->ToString() + "\n";
	}
	return str;
}